

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBuiltinFunctions.hpp
# Opt level: O1

float rsg::
      UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::SinOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::SinOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::SinOp>_>
      ::getWeight(GeneratorState *state,ConstValueRangeAccess valueRange)

{
  float __x;
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  bool bVar7;
  float fVar8;
  float in_XMM3_Da;
  float fVar9;
  float local_54;
  float local_50;
  
  fVar5 = 0.0;
  if ((valueRange.m_type)->m_baseType == TYPE_FLOAT) {
    iVar1 = state->m_shaderParams->maxExpressionDepth;
    iVar2 = state->m_expressionDepth;
    iVar3 = getConservativeValueExprDepth(state,valueRange);
    fVar5 = 0.0;
    if (iVar3 + 1 <= iVar1 - iVar2) {
      if ((valueRange.m_type)->m_numElements < 1) {
        fVar5 = 1.0;
      }
      else {
        fVar5 = 1.0;
        lVar4 = 0;
        do {
          VariableType::getElementType(valueRange.m_type);
          fVar8 = valueRange.m_min[lVar4].floatVal;
          VariableType::getElementType(valueRange.m_type);
          fVar9 = 1.0;
          if (-INFINITY < fVar8) {
            __x = valueRange.m_max[lVar4].floatVal;
            fVar9 = 1.0;
            if (__x < INFINITY) {
              bVar7 = fVar8 <= 1.0 && -1.0 <= __x;
              if (bVar7) {
                in_XMM3_Da = -1.5707964;
                if (-1.0 <= fVar8) {
                  in_XMM3_Da = asinf(fVar8);
                }
                if (__x <= 1.0) {
                  local_50 = asinf(__x);
                }
                else {
                  local_50 = 1.5707964;
                }
              }
              fVar9 = 0.0;
              if (bVar7) {
                fVar9 = in_XMM3_Da * 8.0;
                local_54 = ceilf(fVar9);
                local_54 = local_54 * 0.125;
                if (local_54 <= local_50) {
                  fVar6 = floorf(local_50 * 8.0);
                  bVar7 = local_54 <= fVar6 * 0.125;
                  if (bVar7) {
                    local_50 = fVar6 * 0.125;
                  }
                }
                else {
                  bVar7 = false;
                  local_54 = in_XMM3_Da;
                }
                in_XMM3_Da = fVar9;
                fVar9 = 0.0;
                if (bVar7) {
                  if ((fVar8 != __x) || (fVar9 = 1.0, NAN(fVar8) || NAN(__x))) {
                    local_50 = sinf(local_50);
                    fVar9 = sinf(local_54);
                    fVar8 = (local_50 - fVar9) / (__x - fVar8);
                    fVar9 = 0.1;
                    if (0.1 <= fVar8) {
                      fVar9 = fVar8;
                    }
                  }
                }
              }
            }
          }
          fVar5 = fVar5 * fVar9;
          lVar4 = lVar4 + 1;
        } while (lVar4 < (valueRange.m_type)->m_numElements);
      }
    }
  }
  return fVar5;
}

Assistant:

static inline void computeValueRange (float outMin, float outMax, float& inMin, float& inMax)
	{
		DE_VERIFY(C::transformValueRange(outMin, outMax, inMin, inMax));
		DE_VERIFY(quantizeFloatRange(inMin, inMax));
		DE_ASSERT(inMin <= inMax);
	}